

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O0

char * u_austrcpy_63(char *s1,UChar *ucs2)

{
  UBool UVar1;
  int32_t iVar2;
  UConverter *cnv_00;
  int32_t len;
  UConverter *cnv;
  UChar *pUStack_18;
  UErrorCode err;
  UChar *ucs2_local;
  char *s1_local;
  
  cnv._4_4_ = U_ZERO_ERROR;
  pUStack_18 = ucs2;
  ucs2_local = (UChar *)s1;
  cnv_00 = u_getDefaultConverter_63((UErrorCode *)((long)&cnv + 4));
  UVar1 = U_SUCCESS(cnv._4_4_);
  if ((UVar1 == '\0') || (cnv_00 == (UConverter *)0x0)) {
    *(undefined1 *)ucs2_local = 0;
  }
  else {
    iVar2 = ucnv_fromUChars_63(cnv_00,(char *)ucs2_local,0xfffffff,pUStack_18,-1,
                               (UErrorCode *)((long)&cnv + 4));
    u_releaseDefaultConverter_63(cnv_00);
    *(undefined1 *)((long)ucs2_local + (long)iVar2) = 0;
  }
  return (char *)ucs2_local;
}

Assistant:

U_CAPI char*  U_EXPORT2
u_austrcpy(char *s1,
         const UChar *ucs2 )
{
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    int32_t len = ucnv_fromUChars(cnv,
                  s1,
                  MAX_STRLEN,
                  ucs2,
                  -1,
                  &err);
    u_releaseDefaultConverter(cnv);
    s1[len] = 0;
  } else {
    *s1 = 0;
  }
  return s1;
}